

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.h
# Opt level: O2

string * __thiscall
cmGlobalUnixMakefileGenerator3::GetName_abi_cxx11_
          (string *__return_storage_ptr__,cmGlobalUnixMakefileGenerator3 *this)

{
  GetActualName_abi_cxx11_();
  return __return_storage_ptr__;
}

Assistant:

std::string GetName() const override
  {
    return cmGlobalUnixMakefileGenerator3::GetActualName();
  }